

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WFXMLScanner.cpp
# Opt level: O0

bool __thiscall
xercesc_4_0::WFXMLScanner::scanAttValue(WFXMLScanner *this,XMLCh *attrName,XMLBuffer *toFill)

{
  ulong uVar1;
  bool bVar2;
  int iVar3;
  UnexpectedEOFException *this_00;
  XMLSize_t XVar4;
  XMLSize_t XVar5;
  XMLReader *pXVar6;
  EndOfEntityException *anon_var_0;
  XMLCh tmpBuf [9];
  byte local_3e;
  byte local_3d;
  XMLCh local_3c;
  XMLCh local_3a;
  bool escaped;
  bool gotLeadingSurrogate;
  XMLCh secondCh;
  XMLSize_t XStack_38;
  XMLCh nextCh;
  XMLSize_t curReader;
  XMLBuffer *pXStack_28;
  XMLCh quoteCh;
  XMLBuffer *toFill_local;
  XMLCh *attrName_local;
  WFXMLScanner *this_local;
  
  pXStack_28 = toFill;
  toFill_local = (XMLBuffer *)attrName;
  attrName_local = (XMLCh *)this;
  XMLBuffer::reset(toFill);
  bVar2 = ReaderMgr::skipIfQuote
                    (&(this->super_XMLScanner).fReaderMgr,(XMLCh *)((long)&curReader + 6));
  if (!bVar2) {
    return false;
  }
  XStack_38 = ReaderMgr::getCurrentReaderNum(&(this->super_XMLScanner).fReaderMgr);
  local_3c = L'\0';
  local_3d = 0;
LAB_0037ad49:
  do {
    local_3a = ReaderMgr::getNextChar(&(this->super_XMLScanner).fReaderMgr);
    XVar5 = XStack_38;
    if (local_3a == L'\0') {
      this_00 = (UnexpectedEOFException *)__cxa_allocate_exception(0x30);
      UnexpectedEOFException::UnexpectedEOFException
                (this_00,
                 "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/internal/WFXMLScanner.cpp"
                 ,0x603,Gen_UnexpectedEOF,(this->super_XMLScanner).fMemoryManager);
      __cxa_throw(this_00,&UnexpectedEOFException::typeinfo,
                  UnexpectedEOFException::~UnexpectedEOFException);
    }
    if (local_3a == curReader._6_2_) {
      XVar4 = ReaderMgr::getCurrentReaderNum(&(this->super_XMLScanner).fReaderMgr);
      uVar1 = XStack_38;
      if (XVar5 == XVar4) {
        return true;
      }
      XVar5 = ReaderMgr::getCurrentReaderNum(&(this->super_XMLScanner).fReaderMgr);
      if (XVar5 < uVar1) {
        XMLScanner::emitError(&this->super_XMLScanner,PartialMarkupInEntity);
        return false;
      }
    }
    local_3e = 0;
    if (local_3a == L'&') {
      iVar3 = (*(this->super_XMLScanner).super_XMLBufferFullHandler._vptr_XMLBufferFullHandler[0xd])
                        (this,1,&local_3a,&local_3c,&local_3e);
      if (iVar3 != 1) {
        local_3d = 0;
        goto LAB_0037ad49;
      }
    }
    else if (((ushort)local_3a < 0xd800) || (0xdbff < (ushort)local_3a)) {
      if (((ushort)local_3a < 0xdc00) || (0xdfff < (ushort)local_3a)) {
        if ((local_3d & 1) == 0) {
          pXVar6 = ReaderMgr::getCurrentReader(&(this->super_XMLScanner).fReaderMgr);
          bVar2 = XMLReader::isXMLChar(pXVar6,local_3a);
          if (!bVar2) {
            XMLString::binToText
                      ((uint)(ushort)local_3a,(XMLCh *)&anon_var_0,8,0x10,
                       (this->super_XMLScanner).fMemoryManager);
            XMLScanner::emitError
                      (&this->super_XMLScanner,InvalidCharacterInAttrValue,(XMLCh *)toFill_local,
                       (XMLCh *)&anon_var_0,(XMLCh *)0x0,(XMLCh *)0x0);
          }
        }
        else {
          XMLScanner::emitError(&this->super_XMLScanner,Expected2ndSurrogateChar);
        }
      }
      else if ((local_3d & 1) == 0) {
        XMLScanner::emitError(&this->super_XMLScanner,Unexpected2ndSurrogateChar);
      }
      local_3d = 0;
    }
    else if ((local_3d & 1) == 0) {
      local_3d = 1;
    }
    else {
      XMLScanner::emitError(&this->super_XMLScanner,Expected2ndSurrogateChar);
    }
    if ((local_3e & 1) == 0) {
      if (local_3a == L'<') {
        XMLScanner::emitError
                  (&this->super_XMLScanner,BracketInAttrValue,(XMLCh *)toFill_local,(XMLCh *)0x0,
                   (XMLCh *)0x0,(XMLCh *)0x0);
      }
      else {
        pXVar6 = ReaderMgr::getCurrentReader(&(this->super_XMLScanner).fReaderMgr);
        bVar2 = XMLReader::isWhitespace(pXVar6,local_3a);
        if (bVar2) {
          local_3a = L' ';
        }
      }
    }
    XMLBuffer::append(pXStack_28,local_3a);
    if (local_3c != L'\0') {
      XMLBuffer::append(pXStack_28,local_3c);
      local_3c = L'\0';
    }
  } while( true );
}

Assistant:

bool WFXMLScanner::scanAttValue(const XMLCh* const attrName
                              ,     XMLBuffer&   toFill)
{
    // Reset the target buffer
    toFill.reset();

    // Get the next char which must be a single or double quote
    XMLCh quoteCh;
    if (!fReaderMgr.skipIfQuote(quoteCh))
        return false;

    //  We have to get the current reader because we have to ignore closing
    //  quotes until we hit the same reader again.
    const XMLSize_t curReader = fReaderMgr.getCurrentReaderNum();

    //  Loop until we get the attribute value. Note that we use a double
    //  loop here to avoid the setup/teardown overhead of the exception
    //  handler on every round.
    XMLCh   nextCh;
    XMLCh   secondCh = 0;
    bool    gotLeadingSurrogate = false;
    bool    escaped;
    while (true)
    {
    try
    {
        while(true)
        {
            nextCh = fReaderMgr.getNextChar();

            if (!nextCh)
                ThrowXMLwithMemMgr(UnexpectedEOFException, XMLExcepts::Gen_UnexpectedEOF, fMemoryManager);

            // Check for our ending quote in the same entity
            if (nextCh == quoteCh)
            {
                if (curReader == fReaderMgr.getCurrentReaderNum())
                    return true;

                // Watch for spillover into a previous entity
                if (curReader > fReaderMgr.getCurrentReaderNum())
                {
                    emitError(XMLErrs::PartialMarkupInEntity);
                    return false;
                }
            }

            //  Check for an entity ref now, before we let it affect our
            //  whitespace normalization logic below. We ignore the empty flag
            //  in this one.
            escaped = false;
            if (nextCh == chAmpersand)
            {
                if (scanEntityRef(true, nextCh, secondCh, escaped) != EntityExp_Returned)
                {
                    gotLeadingSurrogate = false;
                    continue;
                }
            }
            else if ((nextCh >= 0xD800) && (nextCh <= 0xDBFF))
            {
                // Deal with surrogate pairs
                //  Its a leading surrogate. If we already got one, then
                //  issue an error, else set leading flag to make sure that
                //  we look for a trailing next time.
                if (gotLeadingSurrogate)
                {
                    emitError(XMLErrs::Expected2ndSurrogateChar);
                }
                else
                    gotLeadingSurrogate = true;
            }
            else
            {
                //  If its a trailing surrogate, make sure that we are
                //  prepared for that. Else, its just a regular char so make
                //  sure that we were not expected a trailing surrogate.
                if ((nextCh >= 0xDC00) && (nextCh <= 0xDFFF))
                {
                    // Its trailing, so make sure we were expecting it
                    if (!gotLeadingSurrogate)
                        emitError(XMLErrs::Unexpected2ndSurrogateChar);
                }
                else
                {
                    //  Its just a char, so make sure we were not expecting a
                    //  trailing surrogate.
                    if (gotLeadingSurrogate) {
                        emitError(XMLErrs::Expected2ndSurrogateChar);
                    }
                    // Its got to at least be a valid XML character
                    else if (!fReaderMgr.getCurrentReader()->isXMLChar(nextCh))
                    {
                        XMLCh tmpBuf[9];
                        XMLString::binToText
                        (
                            nextCh
                            , tmpBuf
                            , 8
                            , 16
                            , fMemoryManager
                        );
                        emitError(XMLErrs::InvalidCharacterInAttrValue, attrName, tmpBuf);
                    }
                }
                gotLeadingSurrogate = false;
            }

            //  If its not escaped, then make sure its not a < character, which
            //  is not allowed in attribute values.
            if (!escaped) {
                if (nextCh == chOpenAngle)
                    emitError(XMLErrs::BracketInAttrValue, attrName);
                else if (fReaderMgr.getCurrentReader()->isWhitespace(nextCh))
                    nextCh = chSpace;
            }

            // Else add it to the buffer
            toFill.append(nextCh);

            if (secondCh)
            {
                toFill.append(secondCh);
                secondCh=0;
            }
        }
    }
    catch(const EndOfEntityException&)
    {
        // Just eat it and continue.
        gotLeadingSurrogate = false;
        escaped = false;
    }
    }
    return true;
}